

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O0

void __thiscall
crnlib::dxt1_endpoint_optimizer::compute_pca
          (dxt1_endpoint_optimizer *this,vec3F *axis,vec3F_array *norm_colors,vec3F *def)

{
  uint uVar1;
  vec<3U,_float> *this_00;
  unique_color *puVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double len;
  double delta;
  double m;
  double b_1;
  double g_1;
  double r_1;
  double dStack_98;
  uint iter;
  double vfb;
  double vfg;
  double vfr;
  double weight;
  float b;
  float g;
  float r;
  vec3F *v;
  double dStack_58;
  uint i;
  double cov [6];
  vec3F *def_local;
  vec3F_array *norm_colors_local;
  vec3F *axis_local;
  dxt1_endpoint_optimizer *this_local;
  
  cov[5] = (double)def;
  memset(&stack0xffffffffffffffa8,0,0x30);
  for (v._4_4_ = 0; uVar1 = vector<crnlib::vec<3U,_float>_>::size(norm_colors), v._4_4_ < uVar1;
      v._4_4_ = v._4_4_ + 1) {
    this_00 = vector<crnlib::vec<3U,_float>_>::operator[](norm_colors,v._4_4_);
    fVar3 = vec<3U,_float>::operator[](this_00,0);
    fVar4 = vec<3U,_float>::operator[](this_00,1);
    fVar5 = vec<3U,_float>::operator[](this_00,2);
    puVar2 = vector<crnlib::unique_color>::operator[](&this->m_unique_colors,v._4_4_);
    if (puVar2->m_weight < 2) {
      dStack_58 = (double)(fVar3 * fVar3) + dStack_58;
      cov[0] = (double)(fVar3 * fVar4) + cov[0];
      cov[1] = (double)(fVar3 * fVar5) + cov[1];
      cov[2] = (double)(fVar4 * fVar4) + cov[2];
      cov[3] = (double)(fVar4 * fVar5) + cov[3];
      cov[4] = (double)(fVar5 * fVar5) + cov[4];
    }
    else {
      puVar2 = vector<crnlib::unique_color>::operator[](&this->m_unique_colors,v._4_4_);
      dVar6 = (double)puVar2->m_weight;
      dStack_58 = (double)(fVar3 * fVar3) * dVar6 + dStack_58;
      cov[0] = (double)(fVar3 * fVar4) * dVar6 + cov[0];
      cov[1] = (double)(fVar3 * fVar5) * dVar6 + cov[1];
      cov[2] = (double)(fVar4 * fVar4) * dVar6 + cov[2];
      cov[3] = (double)(fVar4 * fVar5) * dVar6 + cov[3];
      cov[4] = (double)(fVar5 * fVar5) * dVar6 + cov[4];
    }
  }
  vfg = 0.8999999761581421;
  vfb = 1.0;
  dStack_98 = 0.699999988079071;
  for (r_1._4_4_ = 0; r_1._4_4_ < 8; r_1._4_4_ = r_1._4_4_ + 1) {
    g_1 = dStack_98 * cov[1] + vfg * dStack_58 + vfb * cov[0];
    b_1 = dStack_98 * cov[3] + vfg * cov[0] + vfb * cov[2];
    m = dStack_98 * cov[4] + vfg * cov[1] + vfb * cov[3];
    dVar6 = math::maximum<double>(ABS(g_1),ABS(b_1),ABS(m));
    if (1e-10 < dVar6) {
      dVar6 = 1.0 / dVar6;
      g_1 = dVar6 * g_1;
      b_1 = dVar6 * b_1;
      m = dVar6 * m;
    }
    dVar6 = math::square<double>(vfg - g_1);
    dVar7 = math::square<double>(vfb - b_1);
    dVar8 = math::square<double>(dStack_98 - m);
    vfg = g_1;
    vfb = b_1;
    dStack_98 = m;
    if ((2 < r_1._4_4_) && (dVar6 + dVar7 + dVar8 < 1e-08)) break;
  }
  dVar6 = dStack_98 * dStack_98 + vfg * vfg + vfb * vfb;
  if (1e-10 <= dVar6) {
    dVar6 = sqrt(dVar6);
    dVar6 = 1.0 / dVar6;
    vec<3U,_float>::set(axis,(float)(vfg * dVar6),(float)(vfb * dVar6),(float)(dStack_98 * dVar6));
  }
  else {
    vec<3U,_float>::operator=(axis,(vec<3U,_float> *)cov[5]);
  }
  return;
}

Assistant:

void dxt1_endpoint_optimizer::compute_pca(vec3F& axis, const vec3F_array& norm_colors, const vec3F& def)
    {
        double cov[6] = { 0, 0, 0, 0, 0, 0 };
        for (uint i = 0; i < norm_colors.size(); i++)
        {
            const vec3F& v = norm_colors[i];
            float r = v[0];
            float g = v[1];
            float b = v[2];
            if (m_unique_colors[i].m_weight > 1)
            {
                const double weight = m_unique_colors[i].m_weight;
                cov[0] += r * r * weight;
                cov[1] += r * g * weight;
                cov[2] += r * b * weight;
                cov[3] += g * g * weight;
                cov[4] += g * b * weight;
                cov[5] += b * b * weight;
            }
            else
            {
                cov[0] += r * r;
                cov[1] += r * g;
                cov[2] += r * b;
                cov[3] += g * g;
                cov[4] += g * b;
                cov[5] += b * b;
            }
        }
        double vfr = .9f;
        double vfg = 1.0f;
        double vfb = .7f;
        for (uint iter = 0; iter < 8; iter++)
        {
            double r = vfr * cov[0] + vfg * cov[1] + vfb * cov[2];
            double g = vfr * cov[1] + vfg * cov[3] + vfb * cov[4];
            double b = vfr * cov[2] + vfg * cov[4] + vfb * cov[5];
            double m = math::maximum(fabs(r), fabs(g), fabs(b));
            if (m > 1e-10)
            {
                m = 1.0f / m;
                r *= m;
                g *= m;
                b *= m;
            }
            double delta = math::square(vfr - r) + math::square(vfg - g) + math::square(vfb - b);
            vfr = r;
            vfg = g;
            vfb = b;
            if ((iter > 2) && (delta < 1e-8))
            {
                break;
            }
        }
        double len = vfr * vfr + vfg * vfg + vfb * vfb;
        if (len < 1e-10)
        {
            axis = def;
        }
        else
        {
            len = 1.0f / sqrt(len);
            axis.set(static_cast<float>(vfr * len), static_cast<float>(vfg * len), static_cast<float>(vfb * len));
        }
    }